

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O3

uintptr_t ht_feature_cached_string_add_mapping_dynamic(HT_Timeline *timeline,char *label)

{
  HT_FeatureKlass *mtx;
  char cVar1;
  HT_Feature *pHVar2;
  size_t __n;
  char *pcVar3;
  uint uVar4;
  uint64_t key;
  
  pHVar2 = ht_timeline_get_feature
                     (timeline,(HT_FeatureKlass *)HT_FeatureCachedString_get_class_feature_klass);
  if (pHVar2 != (HT_Feature *)0x0) {
    cVar1 = *label;
    if (cVar1 == '\0') {
      key = 0x1505;
    }
    else {
      pcVar3 = label + 1;
      uVar4 = 0x1505;
      do {
        uVar4 = (int)cVar1 + uVar4 * 0x21;
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar1 != '\0');
      key = (uint64_t)uVar4;
    }
    if (pHVar2[1].klass != (HT_FeatureKlass *)0x0) {
      ht_mutex_lock((HT_Mutex *)pHVar2[1].klass);
    }
    pcVar3 = ht_hash_map_get_value((HT_HashMap *)(pHVar2 + 2),key);
    mtx = pHVar2[1].klass;
    if (pcVar3 == (char *)0x0) {
      if (mtx != (HT_FeatureKlass *)0x0) {
        ht_mutex_unlock((HT_Mutex *)mtx);
      }
      __n = strlen(label);
      pcVar3 = (char *)ht_alloc(__n + 1);
      memcpy(pcVar3,label,__n);
      pcVar3[__n] = '\0';
      ht_feature_cached_string_add_mapping_(timeline,(HT_HashMap *)(pHVar2 + 2),key,pcVar3);
    }
    else if (mtx != (HT_FeatureKlass *)0x0) {
      ht_mutex_unlock((HT_Mutex *)mtx);
    }
    return key;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/feature_cached_string.c"
                ,0xac,
                "uintptr_t ht_feature_cached_string_add_mapping_dynamic(HT_Timeline *, const char *)"
               );
}

Assistant:

uintptr_t
ht_feature_cached_string_add_mapping_dynamic(HT_Timeline* timeline, const char* label)
{
    HT_FeatureCachedString* f = HT_FeatureCachedString_from_timeline(timeline);
    uintptr_t hash_value;

    assert(f);

    hash_value = djb2_hash(label);

    HT_FCS_LOCK_(f);

    if (ht_hash_map_get_value(&f->dynamic_hashes, hash_value) == NULL)
    {
        HT_FCS_UNLOCK_(f);

        size_t label_len = strlen(label);
        char* new_label = (char*)ht_alloc(label_len + 1);
        memcpy(new_label, label, label_len);
        new_label[label_len] = 0;

        ht_feature_cached_string_add_mapping_(timeline, &f->dynamic_hashes, hash_value, new_label);
    }
    else
    {
        HT_FCS_UNLOCK_(f);
    }

    return hash_value;
}